

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.hpp
# Opt level: O0

method_result __thiscall
boost::python::override::operator()
          (override *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a0,
          uint *a1)

{
  PyObject *pPVar1;
  _object *p_Var2;
  _object *p_Var3;
  object_base *in_RSI;
  string *in_RDI;
  method_result *x;
  uint *in_stack_ffffffffffffff88;
  handle<_object> x_00;
  handle<_object> local_38;
  handle<_object> local_30;
  undefined1 local_21;
  
  local_21 = 0;
  x_00.m_p = (_object *)in_RDI;
  pPVar1 = api::object_base::ptr(in_RSI);
  converter::
  arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  arg_to_python((arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)pPVar1,(string *)x_00.m_p);
  p_Var2 = handle<_object>::get(&local_30);
  converter::arg_to_python<unsigned_int>::arg_to_python
            ((arg_to_python<unsigned_int> *)in_RDI,in_stack_ffffffffffffff88);
  p_Var3 = handle<_object>::get(&local_38);
  pPVar1 = (PyObject *)PyEval_CallFunction(pPVar1,"(OO)",p_Var2,p_Var3);
  detail::method_result::method_result((method_result *)in_RDI,pPVar1);
  converter::arg_to_python<unsigned_int>::~arg_to_python((arg_to_python<unsigned_int> *)0x3e6d42);
  converter::
  arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~arg_to_python((arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x3e6d4c);
  return (method_result)(handle<_object>)x_00.m_p;
}

Assistant:

detail::method_result
operator()( BOOST_PP_ENUM_BINARY_PARAMS_Z(1, N, A, const& a) ) const
{
    detail::method_result x(
        PyEval_CallFunction(
            this->ptr()
          , const_cast<char*>("(" BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_FIXED, "O") ")")
            BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_fast_arg_to_python_get, nil)
        ));
    return x;
}